

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strparse.c
# Opt level: O0

int Curl_str_quotedword(char **linep,Curl_str *out,size_t max)

{
  char *pcVar1;
  bool bVar2;
  ulong local_38;
  size_t len;
  char *s;
  size_t max_local;
  Curl_str *out_local;
  char **linep_local;
  
  pcVar1 = *linep;
  local_38 = 0;
  Curl_str_init(out);
  if (*pcVar1 == '\"') {
    do {
      len = (long)pcVar1 + 1;
      bVar2 = false;
      if (*(char *)len != '\0') {
        bVar2 = *(char *)len != '\"';
      }
      if (!bVar2) {
        if (*(char *)len != '\"') {
          return 4;
        }
        out->str = *linep + 1;
        out->len = local_38;
        *linep = pcVar1 + 2;
        return 0;
      }
      local_38 = local_38 + 1;
      pcVar1 = (char *)len;
    } while (local_38 <= max);
    linep_local._4_4_ = 1;
  }
  else {
    linep_local._4_4_ = 3;
  }
  return linep_local._4_4_;
}

Assistant:

int Curl_str_quotedword(const char **linep, struct Curl_str *out,
                        const size_t max)
{
  const char *s = *linep;
  size_t len = 0;
  DEBUGASSERT(linep && *linep && out && max);

  Curl_str_init(out);
  if(*s != '\"')
    return STRE_BEGQUOTE;
  s++;
  while(*s && (*s != '\"')) {
    s++;
    if(++len > max)
      return STRE_BIG;
  }
  if(*s != '\"')
    return STRE_ENDQUOTE;
  out->str = (*linep) + 1;
  out->len = len;
  *linep = s + 1;
  return STRE_OK;
}